

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O2

void __thiscall section_data::polygon_to_gds(section_data *this,string *outpath)

{
  _Base_ptr p_Var1;
  _Base_ptr *in_RCX;
  _Base_ptr corX;
  void *__buf;
  _Self __tmp;
  vector<int,_std::allocator<int>_> y_cor;
  vector<int,_std::allocator<int>_> x_cor;
  gdscpp my_polygons;
  gdsSTR main;
  _Vector_base<int,_std::allocator<int>_> local_388;
  _Vector_base<int,_std::allocator<int>_> local_368;
  gdscpp local_348;
  gdsSTR local_288;
  gdsBOUNDARY local_190;
  gdsSTR local_128;
  
  gdscpp::gdscpp(&local_348);
  gdsSTR::gdsSTR(&local_288);
  std::__cxx11::string::assign((char *)&local_288);
  local_368._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_368._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_368._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_388._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_388._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_388._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (p_Var1 = (this->polygons)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->polygons)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    for (corX = p_Var1[1]._M_parent; corX < p_Var1[1]._M_left; corX = (_Base_ptr)&corX[1]._M_left) {
      in_RCX = &corX->_M_right;
      drawBoundary(&local_190,p_Var1[1]._M_color,(vector<int,_std::allocator<int>_> *)corX,
                   (vector<int,_std::allocator<int>_> *)in_RCX);
      std::vector<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_>::emplace_back<gdsBOUNDARY>
                (&local_288.BOUNDARY,&local_190);
      gdsBOUNDARY::~gdsBOUNDARY(&local_190);
    }
  }
  gdsSTR::gdsSTR(&local_128,&local_288);
  gdscpp::setSTR(&local_348,&local_128);
  gdsSTR::~gdsSTR(&local_128);
  gdscpp::write(&local_348,(int)outpath,__buf,(size_t)in_RCX);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_388);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_368);
  gdsSTR::~gdsSTR(&local_288);
  gdscpp::~gdscpp(&local_348);
  return;
}

Assistant:

void section_data::polygon_to_gds(const string &outpath)
{
  gdscpp my_polygons;
  gdsSTR main;
  main.name = "Polygons";
  vector<int> x_cor, y_cor;
  // std::map<unsigned int, std::vector<co_ord>> polygons; // key = layer number
  for (auto polymap_it = polygons.begin(); polymap_it != polygons.end();
       polymap_it++) {
    for (auto layer_polygon_it = polymap_it->second.begin();
         layer_polygon_it < polymap_it->second.end(); layer_polygon_it++) {
      main.BOUNDARY.push_back(drawBoundary(
          polymap_it->first, layer_polygon_it->x, layer_polygon_it->y));
    }
  }
  my_polygons.setSTR(main);
  my_polygons.write(outpath);
}